

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonemeta.cpp
# Opt level: O3

UnicodeString *
icu_63::ZoneMeta::formatCustomID
          (uint8_t hour,uint8_t min,uint8_t sec,UBool negative,UnicodeString *id)

{
  short sVar1;
  int32_t length;
  UChar local_2a;
  
  UnicodeString::unBogus(id);
  sVar1 = (id->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    length = (id->fUnion).fFields.fLength;
  }
  else {
    length = (int)sVar1 >> 5;
  }
  UnicodeString::doReplace(id,0,length,L"GMT",0,-1);
  if (min != '\0' || hour != '\0') {
    if (negative == '\0') {
      local_2a = L'+';
    }
    else {
      local_2a = L'-';
    }
    UnicodeString::doAppend(id,&local_2a,0,1);
    local_2a = (UChar)(byte)((byte)((uint)(byte)(hour + (char)((uint)hour * 0x29 >> 0xc) * -100) *
                                    0x67 >> 10) | 0x30);
    UnicodeString::doAppend(id,&local_2a,0,1);
    local_2a = (UChar)(byte)(hour + (hour / 5 & 0xfe) * -5 | 0x30);
    UnicodeString::doAppend(id,&local_2a,0,1);
    local_2a = L':';
    UnicodeString::doAppend(id,&local_2a,0,1);
    local_2a = (UChar)(byte)((byte)((uint)(byte)(min + (char)((uint)min * 0x29 >> 0xc) * -100) *
                                    0x67 >> 10) | 0x30);
    UnicodeString::doAppend(id,&local_2a,0,1);
    local_2a = (UChar)(byte)(min + (min / 5 & 0xfe) * -5 | 0x30);
    UnicodeString::doAppend(id,&local_2a,0,1);
    if (sec != '\0') {
      local_2a = L':';
      UnicodeString::doAppend(id,&local_2a,0,1);
      local_2a = (UChar)(byte)((byte)((uint)(byte)(sec + (char)((uint)sec * 0x29 >> 0xc) * -100) *
                                      0x67 >> 10) | 0x30);
      UnicodeString::doAppend(id,&local_2a,0,1);
      local_2a = (UChar)(byte)(sec + (sec / 5 & 0xfe) * -5 | 0x30);
      UnicodeString::doAppend(id,&local_2a,0,1);
    }
  }
  return id;
}

Assistant:

UnicodeString&
ZoneMeta::formatCustomID(uint8_t hour, uint8_t min, uint8_t sec, UBool negative, UnicodeString& id) {
    // Create normalized time zone ID - GMT[+|-]HH:mm[:ss]
    id.setTo(gCustomTzPrefix, -1);
    if (hour != 0 || min != 0) {
        if (negative) {
          id.append((UChar)0x2D);    // '-'
        } else {
          id.append((UChar)0x2B);    // '+'
        }
        // Always use US-ASCII digits
        id.append((UChar)(0x30 + (hour%100)/10));
        id.append((UChar)(0x30 + (hour%10)));
        id.append((UChar)0x3A);    // ':'
        id.append((UChar)(0x30 + (min%100)/10));
        id.append((UChar)(0x30 + (min%10)));
        if (sec != 0) {
          id.append((UChar)0x3A);    // ':'
          id.append((UChar)(0x30 + (sec%100)/10));
          id.append((UChar)(0x30 + (sec%10)));
        }
    }
    return id;
}